

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primes.cpp
# Opt level: O2

bool findPrimePower(int q,int *p,int *n)

{
  bool bVar1;
  int k;
  uint uVar2;
  uint n_00;
  
  *n = 0;
  *p = 0;
  if (q < 2) {
    return false;
  }
  bVar1 = isPrime(q);
  if (bVar1) {
    *p = q;
    *n = 1;
  }
  else {
    for (uVar2 = 2;
        (n_00 = 0, (double)(int)uVar2 < SQRT((double)(q + 1)) &&
        (n_00 = uVar2, (uint)q % uVar2 != 0)); uVar2 = uVar2 + 1) {
    }
    bVar1 = isPrime(n_00);
    if (!bVar1) {
      return false;
    }
    while (q != 1) {
      if (q % (int)n_00 != 0) {
        return false;
      }
      *n = *n + 1;
      q = q / (int)n_00;
    }
    *p = n_00;
  }
  return true;
}

Assistant:

bool findPrimePower(int q, int* p, int* n)
{
    int firstfactor = 0;
    *p = *n = 0;

    if (q <= 1)
        return false;

    if (isPrime(q))
    {
        *p = q;
        *n = 1;
        return true;
    }

    for (int k = 2; k < sqrt(double(q) + 1.0); k++)
    {
        if ((q % k) == 0)
        {
            firstfactor = k;
            break;
        }
    }

    if (!isPrime(firstfactor))
        return false;

    while (true)
    {
        if (q == 1)
        {
            *p = firstfactor;
            return true;
        }
        if (q % firstfactor == 0)
        {
            *n += 1;
            q /= firstfactor;
        }
        else
            return false;
    }
}